

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)55>,Fixpp::Required<Fixpp::TagT<2u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<5u,Fixpp::Type::String>>,Fixpp::TagT<3u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<4u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<53u,Fixpp::Type::Float>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<75u,Fixpp::Type::String>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::TagT<30u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_7_>,_Fixpp::Required<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::TagT<3U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>_>
          *tagSet,bool param_4,bool param_5)

{
  byte *pbVar1;
  StreamCursor *this_00;
  long lVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  Type type;
  StreamBuf<char> *pSVar10;
  
  this_00 = context->cursor;
  pSVar10 = this_00->buf;
  lVar2 = *(long *)&pSVar10->field_0x8;
  pcVar9 = *(char **)&pSVar10->field_0x10;
  pcVar6 = pcVar9;
  while( true ) {
    pcVar8 = *(char **)&pSVar10->field_0x18;
    if (pcVar8 == pcVar6) {
      lVar7 = (**(code **)(*(long *)pSVar10 + 0x38))();
      if (lVar7 == 0) {
        pcVar9 = "Expected value tag \'%d\', got EOF";
        type = ParsingError;
        goto LAB_008f5bb5;
      }
      pSVar10 = this_00->buf;
      pcVar6 = *(char **)&pSVar10->field_0x10;
      pcVar8 = *(char **)&pSVar10->field_0x18;
    }
    if (pcVar6 < pcVar8) {
      cVar4 = *pcVar6;
    }
    else {
      cVar4 = (**(code **)(*(long *)pSVar10 + 0x48))();
    }
    if (cVar4 == '|') break;
    StreamCursor::advance(this_00,1);
    pSVar10 = this_00->buf;
    pcVar6 = *(char **)&pSVar10->field_0x10;
  }
  lVar7 = *(long *)&this_00->buf->field_0x8;
  lVar3 = *(long *)&this_00->buf->field_0x10;
  bVar5 = StreamCursor::advance(this_00,1);
  if (bVar5) {
    (field->m_view).first = pcVar9;
    (field->m_view).second = (lVar2 + lVar3) - (long)(pcVar9 + lVar7);
    pbVar1 = (byte *)((long)(tagSet->
                            super_TagSet<Fixpp::Required<Fixpp::TagT<2U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<5U,_Fixpp::Type::String>_>,_Fixpp::TagT<3U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<4U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<53U,_Fixpp::Type::Float>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<75U,_Fixpp::Type::String>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::TagT<30U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>_>
                            ).bits.super__Base_bitset<6UL>._M_w + 0x19);
    *pbVar1 = *pbVar1 | 0x20;
    return;
  }
  pcVar9 = "Expected value after tag \'%d\', got EOF";
  type = Incomplete;
LAB_008f5bb5:
  ParsingContext::setError(context,type,pcVar9,0xcd);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }